

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int bcf_update_format_string(bcf_hdr_t *hdr,bcf1_t *line,char *key,char **values,int n)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  void *values_00;
  char cVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  ulong uVar8;
  
  if (n == 0) {
    iVar2 = bcf_update_format(hdr,line,key,(void *)0x0,0,3);
    return iVar2;
  }
  if (n < 1) {
    uVar8 = 0;
  }
  else {
    uVar6 = 0;
    uVar8 = 0;
    do {
      sVar3 = strlen(values[uVar6]);
      uVar5 = sVar3 & 0xffffffff;
      if ((int)sVar3 < (int)uVar8) {
        uVar5 = uVar8;
      }
      uVar8 = uVar5;
      uVar6 = uVar6 + 1;
    } while ((uint)n != uVar6);
  }
  iVar2 = (int)uVar8;
  values_00 = malloc((long)(iVar2 * n));
  if (values_00 == (void *)0x0) {
    iVar2 = -2;
  }
  else {
    if (0 < n) {
      uVar6 = 0;
      pvVar7 = values_00;
      do {
        pcVar1 = values[uVar6];
        cVar4 = *pcVar1;
        uVar5 = 0;
        if (cVar4 != '\0') {
          uVar5 = 0;
          do {
            *(char *)((long)pvVar7 + uVar5) = cVar4;
            cVar4 = pcVar1[uVar5 + 1];
            uVar5 = uVar5 + 1;
          } while (cVar4 != '\0');
        }
        if ((int)(uint)uVar5 < iVar2) {
          memset((void *)((long)values_00 + (uVar5 & 0xffffffff) + (long)(iVar2 * (int)uVar6)),0,
                 (ulong)(~(uint)uVar5 + iVar2) + 1);
        }
        uVar6 = uVar6 + 1;
        pvVar7 = (void *)((long)pvVar7 + uVar8);
      } while (uVar6 != (uint)n);
    }
    iVar2 = bcf_update_format(hdr,line,key,values_00,iVar2 * n,3);
    free(values_00);
  }
  return iVar2;
}

Assistant:

int bcf_update_format_string(const bcf_hdr_t *hdr, bcf1_t *line, const char *key, const char **values, int n)
{
    if ( !n )
        return bcf_update_format(hdr,line,key,NULL,0,BCF_HT_STR);

    int i, max_len = 0;
    for (i=0; i<n; i++)
    {
        int len = strlen(values[i]);
        if ( len > max_len ) max_len = len;
    }
    char *out = (char*) malloc(max_len*n);
    if ( !out ) return -2;
    for (i=0; i<n; i++)
    {
        char *dst = out+i*max_len;
        const char *src = values[i];
        int j = 0;
        while ( src[j] ) { dst[j] = src[j]; j++; }
        for (; j<max_len; j++) dst[j] = 0;
    }
    int ret = bcf_update_format(hdr,line,key,out,max_len*n,BCF_HT_STR);
    free(out);
    return ret;
}